

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTest<(anonymous_namespace)::optTyped,_testing::internal::TemplateSel<optTyped_copyConstructionForEmpty_Test>,_testing::internal::Types4<mp::opt<bool,_mp::opt_default_policy<bool>_>,_mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>,_mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>,_mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index)

{
  CodeLocation *prefix_00;
  bool bVar1;
  char *type_param;
  TypeId fixture_class_id;
  TestFactoryBase *factory;
  char *pcVar2;
  undefined1 auVar3 [16];
  CodeLocation local_1b8;
  CodeLocation local_190;
  string local_168 [32];
  string local_148;
  string local_128;
  string local_108;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  internal *piStack_28;
  int index_local;
  char *test_names_local;
  char *case_name_local;
  CodeLocation *code_location_local;
  char *prefix_local;
  
  local_2c = index;
  piStack_28 = (internal *)test_names;
  test_names_local = case_name;
  case_name_local = (char *)code_location;
  code_location_local = (CodeLocation *)prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,prefix,&local_d1);
  pcVar2 = "/";
  if ((code_location_local->file)._M_dataplus == (_Alloc_hider)0x0) {
    pcVar2 = "";
  }
  std::operator+(&local_b0,&local_d0,pcVar2);
  std::operator+(&local_90,&local_b0,test_names_local);
  std::operator+(&local_70,&local_90,"/");
  StreamableToString<int>(&local_108,&local_2c);
  std::operator+(&local_50,&local_70,&local_108);
  auVar3 = std::__cxx11::string::c_str();
  GetPrefixUntilComma_abi_cxx11_(&local_148,piStack_28,auVar3._8_8_);
  StripTrailingSpaces(&local_128,&local_148);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  GetTypeName<mp::opt<bool,mp::opt_default_policy<bool>>>();
  type_param = (char *)std::__cxx11::string::c_str();
  CodeLocation::CodeLocation(&local_190,code_location);
  fixture_class_id =
       GetTypeId<(anonymous_namespace)::optTyped<mp::opt<bool,mp::opt_default_policy<bool>>>>();
  factory = (TestFactoryBase *)operator_new(8);
  TestFactoryImpl<optTyped_copyConstructionForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>_>
  ::TestFactoryImpl((TestFactoryImpl<optTyped_copyConstructionForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>_>
                     *)factory);
  MakeAndRegisterTestInfo
            (auVar3._0_8_,pcVar2,type_param,(char *)0x0,&local_190,fixture_class_id,
             Test::SetUpTestCase,Test::TearDownTestCase,factory);
  CodeLocation::~CodeLocation(&local_190);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  prefix_00 = code_location_local;
  CodeLocation::CodeLocation(&local_1b8,code_location);
  bVar1 = TypeParameterizedTest<(anonymous_namespace)::optTyped,_testing::internal::TemplateSel<optTyped_copyConstructionForEmpty_Test>,_testing::internal::Types3<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>,_mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>,_mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>_>
          ::Register((char *)prefix_00,&local_1b8,test_names_local,(char *)piStack_28,local_2c + 1);
  CodeLocation::~CodeLocation(&local_1b8);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix,
                       CodeLocation code_location,
                       const char* case_name, const char* test_names,
                       int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name + "/"
         + StreamableToString(index)).c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        code_location,
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, code_location, case_name, test_names, index + 1);
  }